

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimemagicrule.cpp
# Opt level: O0

bool __thiscall QMimeMagicRule::matches(QMimeMagicRule *this,QByteArray *data)

{
  byte bVar1;
  bool bVar2;
  const_iterator o;
  long *plVar3;
  QMimeMagicRule *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  bool ok;
  const_iterator end;
  const_iterator it;
  QList<QMimeMagicRule> *in_stack_ffffffffffffffa0;
  undefined6 in_stack_ffffffffffffffc0;
  byte bVar4;
  bool local_21;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = 0;
  if (*(long *)(in_RDI + 0x78) != 0) {
    in_stack_ffffffffffffffa0 = *(QList<QMimeMagicRule> **)(in_RDI + 0x78);
    plVar3 = (long *)(in_RDI + *(long *)(in_RDI + 0x80));
    if (((ulong)in_stack_ffffffffffffffa0 & 1) != 0) {
      in_stack_ffffffffffffffa0 =
           *(QList<QMimeMagicRule> **)((long)in_stack_ffffffffffffffa0 + *plVar3 + -1);
    }
    bVar4 = (*(code *)in_stack_ffffffffffffffa0)(plVar3,in_RSI);
  }
  bVar1 = bVar4 & 1;
  if (bVar1 == 0) {
    local_21 = false;
  }
  else {
    bVar2 = QList<QMimeMagicRule>::isEmpty((QList<QMimeMagicRule> *)0x8f4d58);
    if (bVar2) {
      local_21 = true;
    }
    else {
      local_10.i = (QMimeMagicRule *)&DAT_aaaaaaaaaaaaaaaa;
      local_10 = QList<QMimeMagicRule>::begin(in_stack_ffffffffffffffa0);
      o = QList<QMimeMagicRule>::end(in_stack_ffffffffffffffa0);
      while (bVar2 = QList<QMimeMagicRule>::const_iterator::operator!=(&local_10,o), bVar2) {
        QList<QMimeMagicRule>::const_iterator::operator*(&local_10);
        bVar2 = matches(in_RSI,(QByteArray *)
                               CONCAT17(bVar1,CONCAT16(bVar4,in_stack_ffffffffffffffc0)));
        if (bVar2) {
          local_21 = true;
          goto LAB_008f4df4;
        }
        QList<QMimeMagicRule>::const_iterator::operator++(&local_10);
      }
      local_21 = false;
    }
  }
LAB_008f4df4:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_21;
}

Assistant:

bool QMimeMagicRule::matches(const QByteArray &data) const
{
    const bool ok = m_matchFunction && (this->*m_matchFunction)(data);
    if (!ok)
        return false;

    // No submatch? Then we are done.
    if (m_subMatches.isEmpty())
        return true;

    //qDebug() << "Checking" << m_subMatches.count() << "sub-rules";
    // Check that one of the submatches matches too
    for ( QList<QMimeMagicRule>::const_iterator it = m_subMatches.begin(), end = m_subMatches.end() ;
          it != end ; ++it ) {
        if ((*it).matches(data)) {
            // One of the hierarchies matched -> mimetype recognized.
            return true;
        }
    }
    return false;


}